

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O3

uint32_t helper_dcmpuq(CPUPPCState_conflict *env,ppc_fprp_t *a,ppc_fprp_t *b)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  PPC_DFP dfp;
  undefined1 local_e8 [108];
  byte local_7c;
  decNumber_conflict local_60 [3];
  decContext local_3c;
  
  dfp_prepare_decimal128((PPC_DFP *)local_e8,a,b,env);
  decNumberCompare((decNumber_conflict *)(local_e8 + 0x40),(decNumber_conflict *)(local_e8 + 100),
                   local_60,&local_3c);
  decimal128FromNumber((decimal128 *)(local_e8 + 0x10),(decNumber *)(local_e8 + 0x40),&local_3c);
  uVar2 = 1;
  if (((local_e8[0x48] & 0x30) == 0) &&
     (((local_e8._74_2_ != 0 || ((local_e8[0x48] & 0x40) != 0)) || (uVar2 = 2, local_e8._64_4_ != 1)
      ))) {
    uVar2 = (uint)(local_e8[0x48] >> 7) * 4 + 4;
  }
  uVar1 = *(target_ulong_conflict *)(local_e8._0_8_ + 0x116ec);
  uVar3 = uVar2 << 0xc | uVar1 & 0xffff0fff;
  *(uint *)(local_e8._0_8_ + 0x116ec) = uVar3;
  if ((((byte)local_3c.status & 0x80) != 0) &&
     (((local_7c & 0x10) != 0 || ((local_60[0].bits & 0x10) != 0)))) {
    *(uint *)(local_e8._0_8_ + 0x116ec) = (uint)((char)uVar1 < '\0') << 0x1e | uVar3 | 0xa1000000;
  }
  return uVar2;
}

Assistant:

static void CMPO_PPs(struct PPC_DFP *dfp)
{
    dfp_set_CRBF_from_T(dfp);
    dfp_set_FPCC_from_CRBF(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXVC(dfp);
}